

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void nite::dropFrame(void)

{
  size_type sVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  nite *pnStack_10;
  int c;
  size_t total;
  
  pnStack_10 = (nite *)0x0;
  for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
    sVar1 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                      (&targets[local_14].objects);
    in_RDX = extraout_RDX;
    if (sVar1 != 0) {
      sVar1 = std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::size
                        (&targets[local_14].objects);
      pnStack_10 = pnStack_10 + sVar1;
      RenderTarget::clear(targets + local_14);
      in_RDX = extraout_RDX_00;
    }
  }
  toStr_abi_cxx11_(&local_78,pnStack_10,in_RDX);
  std::operator+(&local_58,"drop frame request: ",&local_78);
  std::operator+(&local_38,&local_58," objects");
  print(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void nite::dropFrame(){
	size_t total = 0;
  for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		total += targets[c].objects.size();
    	targets[c].clear();
  }
	nite::print("drop frame request: "+nite::toStr(total)+" objects");
}